

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst16_stage4_ssse3(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  char in_DL;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i cospi_m24_p40;
  __m128i cospi_m56_p08;
  __m128i cospi_p24_m40;
  __m128i cospi_p40_p24;
  __m128i cospi_p56_m08;
  __m128i cospi_p08_p56;
  undefined2 local_8c8;
  undefined2 uStack_8c6;
  undefined2 uStack_8c4;
  undefined2 uStack_8c2;
  undefined2 local_8b8;
  undefined2 uStack_8b6;
  undefined2 uStack_8b4;
  undefined2 uStack_8b2;
  undefined2 local_8a8;
  undefined2 uStack_8a6;
  undefined2 uStack_8a4;
  undefined2 uStack_8a2;
  undefined2 local_898;
  undefined2 uStack_896;
  undefined2 uStack_894;
  undefined2 uStack_892;
  undefined2 local_888;
  undefined2 uStack_886;
  undefined2 uStack_884;
  undefined2 uStack_882;
  undefined2 local_878;
  undefined2 uStack_876;
  undefined2 uStack_874;
  undefined2 uStack_872;
  undefined2 local_868;
  undefined2 uStack_866;
  undefined2 uStack_864;
  undefined2 uStack_862;
  undefined2 local_858;
  undefined2 uStack_856;
  undefined2 uStack_854;
  undefined2 uStack_852;
  undefined2 uStack_840;
  undefined2 uStack_83e;
  undefined2 uStack_83c;
  undefined2 uStack_83a;
  undefined2 uStack_830;
  undefined2 uStack_82e;
  undefined2 uStack_82c;
  undefined2 uStack_82a;
  undefined2 uStack_820;
  undefined2 uStack_81e;
  undefined2 uStack_81c;
  undefined2 uStack_81a;
  undefined2 uStack_810;
  undefined2 uStack_80e;
  undefined2 uStack_80c;
  undefined2 uStack_80a;
  undefined2 uStack_800;
  undefined2 uStack_7fe;
  undefined2 uStack_7fc;
  undefined2 uStack_7fa;
  undefined2 uStack_7f0;
  undefined2 uStack_7ee;
  undefined2 uStack_7ec;
  undefined2 uStack_7ea;
  undefined2 uStack_7e0;
  undefined2 uStack_7de;
  undefined2 uStack_7dc;
  undefined2 uStack_7da;
  undefined2 uStack_7d0;
  undefined2 uStack_7ce;
  undefined2 uStack_7cc;
  undefined2 uStack_7ca;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 local_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 local_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  
  uVar49 = (uint)*(ushort *)(in_RSI + 0x20) | *(int *)(in_RSI + 0xe0) << 0x10;
  uVar45 = CONCAT44(uVar49,uVar49);
  uVar46 = CONCAT44(uVar49,uVar49);
  iVar50 = (uint)*(ushort *)(in_RSI + 0xe0) + *(int *)(in_RSI + 0x20) * -0x10000;
  uVar49 = (uint)*(ushort *)(in_RSI + 0xa0) | *(int *)(in_RSI + 0x60) << 0x10;
  uVar47 = CONCAT44(uVar49,uVar49);
  uVar48 = CONCAT44(uVar49,uVar49);
  iVar51 = (uint)*(ushort *)(in_RSI + 0x60) + *(int *)(in_RSI + 0xa0) * -0x10000;
  uVar49 = -*(int *)(in_RSI + 0xe0) & 0xffffU | *(int *)(in_RSI + 0x20) << 0x10;
  uVar52 = -*(int *)(in_RSI + 0x60) & 0xffffU | *(int *)(in_RSI + 0xa0) << 0x10;
  uVar1 = *(undefined8 *)(in_RDI + 0x80);
  uVar2 = *(undefined8 *)(in_RDI + 0x90);
  local_858 = (undefined2)uVar1;
  uStack_856 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_854 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_852 = (undefined2)((ulong)uVar1 >> 0x30);
  local_868 = (undefined2)uVar2;
  uStack_866 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_864 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_862 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x88);
  uVar2 = *(undefined8 *)(in_RDI + 0x98);
  uStack_7d0 = (undefined2)uVar1;
  uStack_7ce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_7cc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_7ca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_7e0 = (undefined2)uVar2;
  uStack_7de = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_7dc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_7da = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_868;
  auVar28._0_2_ = local_858;
  auVar28._4_2_ = uStack_856;
  auVar28._6_2_ = uStack_866;
  auVar28._10_2_ = uStack_864;
  auVar28._8_2_ = uStack_854;
  auVar28._12_2_ = uStack_852;
  auVar28._14_2_ = uStack_862;
  auVar27._8_8_ = uVar46;
  auVar27._0_8_ = uVar45;
  auVar53 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_7e0;
  auVar26._0_2_ = uStack_7d0;
  auVar26._4_2_ = uStack_7ce;
  auVar26._6_2_ = uStack_7de;
  auVar26._10_2_ = uStack_7dc;
  auVar26._8_2_ = uStack_7cc;
  auVar26._12_2_ = uStack_7ca;
  auVar26._14_2_ = uStack_7da;
  auVar25._8_8_ = uVar46;
  auVar25._0_8_ = uVar45;
  auVar54 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_868;
  auVar24._0_2_ = local_858;
  auVar24._4_2_ = uStack_856;
  auVar24._6_2_ = uStack_866;
  auVar24._10_2_ = uStack_864;
  auVar24._8_2_ = uStack_854;
  auVar24._12_2_ = uStack_852;
  auVar24._14_2_ = uStack_862;
  auVar23._8_8_ = CONCAT44(iVar50,iVar50);
  auVar23._0_8_ = CONCAT44(iVar50,iVar50);
  auVar55 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_7e0;
  auVar22._0_2_ = uStack_7d0;
  auVar22._4_2_ = uStack_7ce;
  auVar22._6_2_ = uStack_7de;
  auVar22._10_2_ = uStack_7dc;
  auVar22._8_2_ = uStack_7cc;
  auVar22._12_2_ = uStack_7ca;
  auVar22._14_2_ = uStack_7da;
  auVar21._8_8_ = CONCAT44(iVar50,iVar50);
  auVar21._0_8_ = CONCAT44(iVar50,iVar50);
  auVar56 = pmaddwd(auVar22,auVar21);
  local_3d8 = auVar53._0_4_;
  uStack_3d4 = auVar53._4_4_;
  uStack_3d0 = auVar53._8_4_;
  uStack_3cc = auVar53._12_4_;
  local_3e8 = (int)in_XMM0_Qa;
  uStack_3e4 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_3e0 = (int)in_XMM0_Qb;
  uStack_3dc = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_3f8 = auVar54._0_4_;
  uStack_3f4 = auVar54._4_4_;
  uStack_3f0 = auVar54._8_4_;
  uStack_3ec = auVar54._12_4_;
  local_418 = auVar55._0_4_;
  uStack_414 = auVar55._4_4_;
  uStack_410 = auVar55._8_4_;
  uStack_40c = auVar55._12_4_;
  local_438 = auVar56._0_4_;
  uStack_434 = auVar56._4_4_;
  uStack_430 = auVar56._8_4_;
  uStack_42c = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar44._4_4_ = uStack_3d4 + uStack_3e4 >> auVar53;
  auVar44._0_4_ = local_3d8 + local_3e8 >> auVar53;
  auVar44._12_4_ = uStack_3cc + uStack_3dc >> auVar53;
  auVar44._8_4_ = uStack_3d0 + uStack_3e0 >> auVar53;
  auVar43._4_4_ = uStack_3f4 + uStack_3e4 >> auVar54;
  auVar43._0_4_ = local_3f8 + local_3e8 >> auVar54;
  auVar43._12_4_ = uStack_3ec + uStack_3dc >> auVar54;
  auVar43._8_4_ = uStack_3f0 + uStack_3e0 >> auVar54;
  auVar53 = packssdw(auVar44,auVar43);
  *(undefined1 (*) [16])(in_RDI + 0x80) = auVar53;
  auVar42._4_4_ = uStack_414 + uStack_3e4 >> auVar55;
  auVar42._0_4_ = local_418 + local_3e8 >> auVar55;
  auVar42._12_4_ = uStack_40c + uStack_3dc >> auVar55;
  auVar42._8_4_ = uStack_410 + uStack_3e0 >> auVar55;
  auVar41._4_4_ = uStack_434 + uStack_3e4 >> auVar56;
  auVar41._0_4_ = local_438 + local_3e8 >> auVar56;
  auVar41._12_4_ = uStack_42c + uStack_3dc >> auVar56;
  auVar41._8_4_ = uStack_430 + uStack_3e0 >> auVar56;
  auVar53 = packssdw(auVar42,auVar41);
  *(undefined1 (*) [16])(in_RDI + 0x90) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0xa0);
  uVar2 = *(undefined8 *)(in_RDI + 0xb0);
  local_878 = (undefined2)uVar1;
  uStack_876 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_874 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_872 = (undefined2)((ulong)uVar1 >> 0x30);
  local_888 = (undefined2)uVar2;
  uStack_886 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_884 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_882 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0xa8);
  uVar2 = *(undefined8 *)(in_RDI + 0xb8);
  uStack_7f0 = (undefined2)uVar1;
  uStack_7ee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_7ec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_7ea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_800 = (undefined2)uVar2;
  uStack_7fe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_7fc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_7fa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_888;
  auVar20._0_2_ = local_878;
  auVar20._4_2_ = uStack_876;
  auVar20._6_2_ = uStack_886;
  auVar20._10_2_ = uStack_884;
  auVar20._8_2_ = uStack_874;
  auVar20._12_2_ = uStack_872;
  auVar20._14_2_ = uStack_882;
  auVar19._8_8_ = uVar48;
  auVar19._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_800;
  auVar18._0_2_ = uStack_7f0;
  auVar18._4_2_ = uStack_7ee;
  auVar18._6_2_ = uStack_7fe;
  auVar18._10_2_ = uStack_7fc;
  auVar18._8_2_ = uStack_7ec;
  auVar18._12_2_ = uStack_7ea;
  auVar18._14_2_ = uStack_7fa;
  auVar17._8_8_ = uVar48;
  auVar17._0_8_ = uVar47;
  auVar54 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_888;
  auVar16._0_2_ = local_878;
  auVar16._4_2_ = uStack_876;
  auVar16._6_2_ = uStack_886;
  auVar16._10_2_ = uStack_884;
  auVar16._8_2_ = uStack_874;
  auVar16._12_2_ = uStack_872;
  auVar16._14_2_ = uStack_882;
  auVar15._8_8_ = CONCAT44(iVar51,iVar51);
  auVar15._0_8_ = CONCAT44(iVar51,iVar51);
  auVar55 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_800;
  auVar14._0_2_ = uStack_7f0;
  auVar14._4_2_ = uStack_7ee;
  auVar14._6_2_ = uStack_7fe;
  auVar14._10_2_ = uStack_7fc;
  auVar14._8_2_ = uStack_7ec;
  auVar14._12_2_ = uStack_7ea;
  auVar14._14_2_ = uStack_7fa;
  auVar13._8_8_ = CONCAT44(iVar51,iVar51);
  auVar13._0_8_ = CONCAT44(iVar51,iVar51);
  auVar56 = pmaddwd(auVar14,auVar13);
  local_458 = auVar53._0_4_;
  uStack_454 = auVar53._4_4_;
  uStack_450 = auVar53._8_4_;
  uStack_44c = auVar53._12_4_;
  local_478 = auVar54._0_4_;
  uStack_474 = auVar54._4_4_;
  uStack_470 = auVar54._8_4_;
  uStack_46c = auVar54._12_4_;
  local_498 = auVar55._0_4_;
  uStack_494 = auVar55._4_4_;
  uStack_490 = auVar55._8_4_;
  uStack_48c = auVar55._12_4_;
  local_4b8 = auVar56._0_4_;
  uStack_4b4 = auVar56._4_4_;
  uStack_4b0 = auVar56._8_4_;
  uStack_4ac = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar40._4_4_ = uStack_454 + uStack_3e4 >> auVar53;
  auVar40._0_4_ = local_458 + local_3e8 >> auVar53;
  auVar40._12_4_ = uStack_44c + uStack_3dc >> auVar53;
  auVar40._8_4_ = uStack_450 + uStack_3e0 >> auVar53;
  auVar39._4_4_ = uStack_474 + uStack_3e4 >> auVar54;
  auVar39._0_4_ = local_478 + local_3e8 >> auVar54;
  auVar39._12_4_ = uStack_46c + uStack_3dc >> auVar54;
  auVar39._8_4_ = uStack_470 + uStack_3e0 >> auVar54;
  auVar53 = packssdw(auVar40,auVar39);
  *(undefined1 (*) [16])(in_RDI + 0xa0) = auVar53;
  auVar38._4_4_ = uStack_494 + uStack_3e4 >> auVar55;
  auVar38._0_4_ = local_498 + local_3e8 >> auVar55;
  auVar38._12_4_ = uStack_48c + uStack_3dc >> auVar55;
  auVar38._8_4_ = uStack_490 + uStack_3e0 >> auVar55;
  auVar37._4_4_ = uStack_4b4 + uStack_3e4 >> auVar56;
  auVar37._0_4_ = local_4b8 + local_3e8 >> auVar56;
  auVar37._12_4_ = uStack_4ac + uStack_3dc >> auVar56;
  auVar37._8_4_ = uStack_4b0 + uStack_3e0 >> auVar56;
  auVar53 = packssdw(auVar38,auVar37);
  *(undefined1 (*) [16])(in_RDI + 0xb0) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0xc0);
  uVar2 = *(undefined8 *)(in_RDI + 0xd0);
  local_898 = (undefined2)uVar1;
  uStack_896 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_894 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_892 = (undefined2)((ulong)uVar1 >> 0x30);
  local_8a8 = (undefined2)uVar2;
  uStack_8a6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_8a4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_8a2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 200);
  uVar2 = *(undefined8 *)(in_RDI + 0xd8);
  uStack_810 = (undefined2)uVar1;
  uStack_80e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_80c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_80a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_820 = (undefined2)uVar2;
  uStack_81e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_81c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_81a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_8a8;
  auVar12._0_2_ = local_898;
  auVar12._4_2_ = uStack_896;
  auVar12._6_2_ = uStack_8a6;
  auVar12._10_2_ = uStack_8a4;
  auVar12._8_2_ = uStack_894;
  auVar12._12_2_ = uStack_892;
  auVar12._14_2_ = uStack_8a2;
  auVar11._8_8_ = CONCAT44(uVar49,uVar49);
  auVar11._0_8_ = CONCAT44(uVar49,uVar49);
  auVar53 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_820;
  auVar10._0_2_ = uStack_810;
  auVar10._4_2_ = uStack_80e;
  auVar10._6_2_ = uStack_81e;
  auVar10._10_2_ = uStack_81c;
  auVar10._8_2_ = uStack_80c;
  auVar10._12_2_ = uStack_80a;
  auVar10._14_2_ = uStack_81a;
  auVar9._8_8_ = CONCAT44(uVar49,uVar49);
  auVar9._0_8_ = CONCAT44(uVar49,uVar49);
  auVar54 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_8a8;
  auVar8._0_2_ = local_898;
  auVar8._4_2_ = uStack_896;
  auVar8._6_2_ = uStack_8a6;
  auVar8._10_2_ = uStack_8a4;
  auVar8._8_2_ = uStack_894;
  auVar8._12_2_ = uStack_892;
  auVar8._14_2_ = uStack_8a2;
  auVar7._8_8_ = uVar46;
  auVar7._0_8_ = uVar45;
  auVar55 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_820;
  auVar6._0_2_ = uStack_810;
  auVar6._4_2_ = uStack_80e;
  auVar6._6_2_ = uStack_81e;
  auVar6._10_2_ = uStack_81c;
  auVar6._8_2_ = uStack_80c;
  auVar6._12_2_ = uStack_80a;
  auVar6._14_2_ = uStack_81a;
  auVar5._8_8_ = uVar46;
  auVar5._0_8_ = uVar45;
  auVar56 = pmaddwd(auVar6,auVar5);
  local_4d8 = auVar53._0_4_;
  uStack_4d4 = auVar53._4_4_;
  uStack_4d0 = auVar53._8_4_;
  uStack_4cc = auVar53._12_4_;
  local_4f8 = auVar54._0_4_;
  uStack_4f4 = auVar54._4_4_;
  uStack_4f0 = auVar54._8_4_;
  uStack_4ec = auVar54._12_4_;
  local_518 = auVar55._0_4_;
  uStack_514 = auVar55._4_4_;
  uStack_510 = auVar55._8_4_;
  uStack_50c = auVar55._12_4_;
  local_538 = auVar56._0_4_;
  uStack_534 = auVar56._4_4_;
  uStack_530 = auVar56._8_4_;
  uStack_52c = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar36._4_4_ = uStack_4d4 + uStack_3e4 >> auVar53;
  auVar36._0_4_ = local_4d8 + local_3e8 >> auVar53;
  auVar36._12_4_ = uStack_4cc + uStack_3dc >> auVar53;
  auVar36._8_4_ = uStack_4d0 + uStack_3e0 >> auVar53;
  auVar35._4_4_ = uStack_4f4 + uStack_3e4 >> auVar54;
  auVar35._0_4_ = local_4f8 + local_3e8 >> auVar54;
  auVar35._12_4_ = uStack_4ec + uStack_3dc >> auVar54;
  auVar35._8_4_ = uStack_4f0 + uStack_3e0 >> auVar54;
  auVar53 = packssdw(auVar36,auVar35);
  *(undefined1 (*) [16])(in_RDI + 0xc0) = auVar53;
  auVar34._4_4_ = uStack_514 + uStack_3e4 >> auVar55;
  auVar34._0_4_ = local_518 + local_3e8 >> auVar55;
  auVar34._12_4_ = uStack_50c + uStack_3dc >> auVar55;
  auVar34._8_4_ = uStack_510 + uStack_3e0 >> auVar55;
  auVar33._4_4_ = uStack_534 + uStack_3e4 >> auVar56;
  auVar33._0_4_ = local_538 + local_3e8 >> auVar56;
  auVar33._12_4_ = uStack_52c + uStack_3dc >> auVar56;
  auVar33._8_4_ = uStack_530 + uStack_3e0 >> auVar56;
  auVar53 = packssdw(auVar34,auVar33);
  *(undefined1 (*) [16])(in_RDI + 0xd0) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0xe0);
  uVar2 = *(undefined8 *)(in_RDI + 0xf0);
  local_8b8 = (undefined2)uVar1;
  uStack_8b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_8b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_8b2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_8c8 = (undefined2)uVar2;
  uStack_8c6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_8c4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_8c2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0xe8);
  uVar2 = *(undefined8 *)(in_RDI + 0xf8);
  uStack_830 = (undefined2)uVar1;
  uStack_82e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_82c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_82a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_840 = (undefined2)uVar2;
  uStack_83e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_83c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_83a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_8c8;
  auVar4._0_2_ = local_8b8;
  auVar4._4_2_ = uStack_8b6;
  auVar4._6_2_ = uStack_8c6;
  auVar4._10_2_ = uStack_8c4;
  auVar4._8_2_ = uStack_8b4;
  auVar4._12_2_ = uStack_8b2;
  auVar4._14_2_ = uStack_8c2;
  auVar57._8_8_ = CONCAT44(uVar52,uVar52);
  auVar57._0_8_ = CONCAT44(uVar52,uVar52);
  auVar57 = pmaddwd(auVar4,auVar57);
  auVar3._2_2_ = uStack_840;
  auVar3._0_2_ = uStack_830;
  auVar3._4_2_ = uStack_82e;
  auVar3._6_2_ = uStack_83e;
  auVar3._10_2_ = uStack_83c;
  auVar3._8_2_ = uStack_82c;
  auVar3._12_2_ = uStack_82a;
  auVar3._14_2_ = uStack_83a;
  auVar58._8_8_ = CONCAT44(uVar52,uVar52);
  auVar58._0_8_ = CONCAT44(uVar52,uVar52);
  auVar58 = pmaddwd(auVar3,auVar58);
  auVar56._2_2_ = local_8c8;
  auVar56._0_2_ = local_8b8;
  auVar56._4_2_ = uStack_8b6;
  auVar56._6_2_ = uStack_8c6;
  auVar56._10_2_ = uStack_8c4;
  auVar56._8_2_ = uStack_8b4;
  auVar56._12_2_ = uStack_8b2;
  auVar56._14_2_ = uStack_8c2;
  auVar55._8_8_ = uVar48;
  auVar55._0_8_ = uVar47;
  auVar55 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_840;
  auVar54._0_2_ = uStack_830;
  auVar54._4_2_ = uStack_82e;
  auVar54._6_2_ = uStack_83e;
  auVar54._10_2_ = uStack_83c;
  auVar54._8_2_ = uStack_82c;
  auVar54._12_2_ = uStack_82a;
  auVar54._14_2_ = uStack_83a;
  auVar53._8_8_ = uVar48;
  auVar53._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar54,auVar53);
  local_558 = auVar57._0_4_;
  uStack_554 = auVar57._4_4_;
  uStack_550 = auVar57._8_4_;
  uStack_54c = auVar57._12_4_;
  local_578 = auVar58._0_4_;
  uStack_574 = auVar58._4_4_;
  uStack_570 = auVar58._8_4_;
  uStack_56c = auVar58._12_4_;
  local_598 = auVar55._0_4_;
  uStack_594 = auVar55._4_4_;
  uStack_590 = auVar55._8_4_;
  uStack_58c = auVar55._12_4_;
  local_5b8 = auVar53._0_4_;
  uStack_5b4 = auVar53._4_4_;
  uStack_5b0 = auVar53._8_4_;
  uStack_5ac = auVar53._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar32._4_4_ = uStack_554 + uStack_3e4 >> auVar53;
  auVar32._0_4_ = local_558 + local_3e8 >> auVar53;
  auVar32._12_4_ = uStack_54c + uStack_3dc >> auVar53;
  auVar32._8_4_ = uStack_550 + uStack_3e0 >> auVar53;
  auVar31._4_4_ = uStack_574 + uStack_3e4 >> auVar54;
  auVar31._0_4_ = local_578 + local_3e8 >> auVar54;
  auVar31._12_4_ = uStack_56c + uStack_3dc >> auVar54;
  auVar31._8_4_ = uStack_570 + uStack_3e0 >> auVar54;
  auVar53 = packssdw(auVar32,auVar31);
  *(undefined1 (*) [16])(in_RDI + 0xe0) = auVar53;
  auVar30._4_4_ = uStack_594 + uStack_3e4 >> auVar55;
  auVar30._0_4_ = local_598 + local_3e8 >> auVar55;
  auVar30._12_4_ = uStack_58c + uStack_3dc >> auVar55;
  auVar30._8_4_ = uStack_590 + uStack_3e0 >> auVar55;
  auVar29._4_4_ = uStack_5b4 + uStack_3e4 >> auVar56;
  auVar29._0_4_ = local_5b8 + local_3e8 >> auVar56;
  auVar29._12_4_ = uStack_5ac + uStack_3dc >> auVar56;
  auVar29._8_4_ = uStack_5b0 + uStack_3e0 >> auVar56;
  auVar53 = packssdw(auVar30,auVar29);
  *(undefined1 (*) [16])(in_RDI + 0xf0) = auVar53;
  return;
}

Assistant:

static inline void iadst16_stage4_ssse3(__m128i *x, const int32_t *cospi,
                                        const __m128i __rounding,
                                        int8_t cos_bit) {
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  const __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  btf_16_sse2(cospi_p08_p56, cospi_p56_m08, x[8], x[9], x[8], x[9]);
  btf_16_sse2(cospi_p40_p24, cospi_p24_m40, x[10], x[11], x[10], x[11]);
  btf_16_sse2(cospi_m56_p08, cospi_p08_p56, x[12], x[13], x[12], x[13]);
  btf_16_sse2(cospi_m24_p40, cospi_p40_p24, x[14], x[15], x[14], x[15]);
}